

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
__thiscall kj::anon_unknown_36::NetworkAddressHttpClient::getClient(NetworkAddressHttpClient *this)

{
  _func_int *p_Var1;
  long lVar2;
  long *plVar3;
  HttpHeaderTable *responseHeaderTable;
  OwnPromiseNode node;
  AsyncIoStream *pAVar4;
  int iVar5;
  Refcounted *refcounted;
  _func_int *p_Var6;
  HttpClientImpl *this_00;
  Disposer *pDVar7;
  undefined4 extraout_var;
  RefcountedClient *extraout_RDX;
  RefcountedClient *extraout_RDX_00;
  RefcountedClient *extraout_RDX_01;
  RefcountedClient *pRVar8;
  _func_int **in_RSI;
  _func_int **pp_Var9;
  _func_int **pp_Var10;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t> OVar11;
  Own<kj::AsyncIoStream,_std::nullptr_t> stream;
  OwnPromiseNode local_80;
  Disposer *local_78;
  AsyncIoStream *pAStack_70;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_68;
  HttpClientSettings local_58;
  
  p_Var6 = in_RSI[0x15];
  if (p_Var6 != in_RSI[0x11]) {
    do {
      p_Var1 = in_RSI[0x16];
      if (p_Var6 == p_Var1) {
        lVar2 = *(long *)(in_RSI[0x18] + -8);
        pp_Var9 = *(_func_int ***)(lVar2 + 0x1e0);
        pp_Var10 = *(_func_int ***)(lVar2 + 0x1e8);
        *(undefined8 *)(lVar2 + 0x1e8) = 0;
        operator_delete(p_Var1,0x1f8);
        p_Var6 = in_RSI[0x18];
        in_RSI[0x18] = p_Var6 + -8;
        p_Var6 = *(_func_int **)(p_Var6 + -8);
        in_RSI[0x16] = p_Var6;
        in_RSI[0x17] = p_Var6 + 0x1f8;
        in_RSI[0x15] = p_Var6 + 0x1e0;
        plVar3 = *(long **)(p_Var6 + 0x1e8);
        if (plVar3 != (long *)0x0) {
          *(undefined8 *)(p_Var6 + 0x1e8) = 0;
          (**(code **)**(undefined8 **)(p_Var6 + 0x1e0))
                    (*(undefined8 **)(p_Var6 + 0x1e0),(long)plVar3 + *(long *)(*plVar3 + -0x10));
        }
      }
      else {
        pp_Var9 = *(_func_int ***)(p_Var6 + -0x18);
        pp_Var10 = *(_func_int ***)(p_Var6 + -0x10);
        *(undefined8 *)(p_Var6 + -0x10) = 0;
        in_RSI[0x15] = p_Var6 + -0x18;
      }
      if ((((*(code *)(pp_Var10 + 0x2e) == (code)0x0) &&
           (*(code *)((long)pp_Var10 + 0x171) == (code)0x0)) &&
          (*(code *)((long)pp_Var10 + 0xe1) == (code)0x0)) &&
         (((*(int *)((long)pp_Var10 + 0xe4) == 0 && (*(code *)(pp_Var10 + 0x23) == (code)0x0)) &&
          ((*(code *)((long)pp_Var10 + 0x119) == (code)0x0 &&
           (*(code *)((long)pp_Var10 + 0x11a) == (code)0x0)))))) {
        pDVar7 = (Disposer *)operator_new(0x28);
        ((MonotonicClock *)&pDVar7->_vptr_Disposer)->_vptr_MonotonicClock =
             (_func_int **)&PTR_disposeImpl_006d8670;
        ((MonotonicClock *)&pDVar7[2]._vptr_Disposer)->_vptr_MonotonicClock = in_RSI;
        ((MonotonicClock *)&pDVar7[3]._vptr_Disposer)->_vptr_MonotonicClock = pp_Var9;
        ((MonotonicClock *)&pDVar7[4]._vptr_Disposer)->_vptr_MonotonicClock = pp_Var10;
        *(int *)(in_RSI + 0xd) = *(int *)(in_RSI + 0xd) + 1;
        *(undefined4 *)&((MonotonicClock *)&pDVar7[1]._vptr_Disposer)->_vptr_MonotonicClock = 1;
        (this->super_HttpClient)._vptr_HttpClient = (_func_int **)pDVar7;
        this->timer = (Timer *)pDVar7;
        pRVar8 = extraout_RDX;
        goto LAB_0040d94a;
      }
      (**(code **)*pp_Var9)(pp_Var9,(_func_int *)((long)pp_Var10 + *(long *)(*pp_Var10 + -0x10)));
      p_Var6 = in_RSI[0x15];
    } while (p_Var6 != in_RSI[0x11]);
  }
  (*(code *)**(undefined8 **)in_RSI[4])(&local_80);
  newPromisedStream((kj *)&local_78,
                    (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_80);
  node.ptr = local_80.ptr;
  if (&(local_80.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_80.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  responseHeaderTable = (HttpHeaderTable *)in_RSI[2];
  this_00 = (HttpClientImpl *)operator_new(0x178);
  local_68.disposer = local_78;
  local_68.ptr = pAStack_70;
  pAStack_70 = (AsyncIoStream *)0x0;
  local_58.idleTimeout.value = (long)in_RSI[5];
  local_58.entropySource.ptr = (EntropySource *)in_RSI[6];
  local_58.errorHandler.ptr = (HttpClientErrorHandler *)in_RSI[7];
  local_58.webSocketCompressionMode = *(WebSocketCompressionMode *)(in_RSI + 8);
  local_58.webSocketErrorHandler.ptr = (WebSocketErrorHandler *)in_RSI[9];
  local_58.tlsContext.ptr = (SecureNetworkWrapper *)in_RSI[10];
  HttpClientImpl::HttpClientImpl(this_00,responseHeaderTable,&local_68,&local_58);
  if (local_68.ptr != (AsyncIoStream *)0x0) {
    (**(local_68.disposer)->_vptr_Disposer)
              (local_68.disposer,
               ((local_68.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
               (long)&((local_68.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream);
  }
  pDVar7 = (Disposer *)operator_new(0x28);
  pAVar4 = pAStack_70;
  ((MonotonicClock *)&pDVar7->_vptr_Disposer)->_vptr_MonotonicClock =
       (_func_int **)&PTR_disposeImpl_006d8670;
  ((MonotonicClock *)&pDVar7[2]._vptr_Disposer)->_vptr_MonotonicClock = in_RSI;
  ((MonotonicClock *)&pDVar7[3]._vptr_Disposer)->_vptr_MonotonicClock =
       (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpClientImpl>::instance;
  ((MonotonicClock *)&pDVar7[4]._vptr_Disposer)->_vptr_MonotonicClock = (_func_int **)this_00;
  *(int *)(in_RSI + 0xd) = *(int *)(in_RSI + 0xd) + 1;
  *(undefined4 *)&((MonotonicClock *)&pDVar7[1]._vptr_Disposer)->_vptr_MonotonicClock = 1;
  (this->super_HttpClient)._vptr_HttpClient = (_func_int **)pDVar7;
  this->timer = (Timer *)pDVar7;
  pRVar8 = extraout_RDX_00;
  if (pAStack_70 != (AsyncIoStream *)0x0) {
    pAStack_70 = (AsyncIoStream *)0x0;
    iVar5 = (**local_78->_vptr_Disposer)(local_78,(long)pAVar4 + *(long *)(*(long *)pAVar4 + -0x10))
    ;
    pDVar7 = (Disposer *)CONCAT44(extraout_var,iVar5);
    pRVar8 = extraout_RDX_01;
  }
LAB_0040d94a:
  OVar11.ptr = pRVar8;
  OVar11.disposer = pDVar7;
  return OVar11;
}

Assistant:

kj::Own<RefcountedClient> getClient() {
    for (;;) {
      if (availableClients.empty()) {
        auto stream = newPromisedStream(address->connect());
        return kj::refcounted<RefcountedClient>(*this,
          kj::heap<HttpClientImpl>(responseHeaderTable, kj::mv(stream), settings));
      } else {
        auto client = kj::mv(availableClients.back().client);
        availableClients.pop_back();
        if (client->canReuse()) {
          return kj::refcounted<RefcountedClient>(*this, kj::mv(client));
        }
        // Whoops, this client's connection was closed by the server at some point. Discard.
      }
    }
  }